

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O0

void polygon_web_validate(Am_Web_Events *events)

{
  bool bVar1;
  Am_Slot_Key AVar2;
  Am_Drawonable *draw_00;
  Am_Value *pAVar3;
  ostream *poVar4;
  char *pcVar5;
  Am_Wrapper *value;
  float fVar6;
  Am_Style local_a8;
  int local_a0;
  int local_9c;
  int new_height;
  int new_width;
  int new_top;
  int new_left;
  Am_Slot_Key local_82;
  Am_Slot AStack_80;
  Am_Slot_Key key;
  byte local_73;
  byte local_72;
  byte local_71;
  int local_70;
  bool bbox_changed;
  bool pl_changed;
  int iStack_6c;
  bool rescaled;
  int height;
  int width;
  int top;
  int left;
  Am_Style ls;
  Am_Point_List pl;
  Am_Drawonable *draw;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object self;
  Am_Slot slot;
  Am_Web_Events *events_local;
  
  Am_Web_Events::End(events);
  self.data = (Am_Object_Data *)Am_Web_Events::Get(events);
  Am_Slot::Get_Owner((Am_Slot *)&local_28);
  Am_Object::Am_Object(&local_20,&local_28);
  Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&local_28);
  Am_Object::Am_Object((Am_Object *)&pl.item,&local_20);
  draw_00 = Get_a_drawonable((Am_Object *)&pl.item);
  Am_Object::~Am_Object((Am_Object *)&pl.item);
  pAVar3 = Am_Object::Get(&local_20,0xb2,0);
  Am_Point_List::Am_Point_List((Am_Point_List *)&ls,pAVar3);
  pAVar3 = Am_Object::Get(&local_20,0x6b,0);
  Am_Style::Am_Style((Am_Style *)&top,pAVar3);
  pAVar3 = Am_Object::Get(&local_20,100,0);
  width = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(&local_20,0x65,0);
  height = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(&local_20,0x66,0);
  iStack_6c = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(&local_20,0x67,0);
  local_70 = Am_Value::operator_cast_to_int(pAVar3);
  local_71 = 0;
  local_72 = 0;
  local_73 = 0;
  Am_Web_Events::End(events);
  while (bVar1 = Am_Web_Events::First(events), ((bVar1 ^ 0xffU) & 1) != 0) {
    AStack_80 = Am_Web_Events::Get(events);
    self.data = (Am_Object_Data *)AStack_80;
    local_82 = Am_Slot::Get_Key((Am_Slot *)&self);
    if (local_82 == 0xb2) {
      bVar1 = Am_Point_List::Valid((Am_Point_List *)&ls);
      if ((bVar1) && (draw_00 != (Am_Drawonable *)0x0)) {
        (*draw_00->_vptr_Am_Drawonable[0x1c])
                  (draw_00,&ls,&top,&width,&height,&stack0xffffffffffffff94,&local_70);
      }
      local_73 = 1;
      break;
    }
    if (local_82 == 100) {
      pAVar3 = Am_Web_Events::Get_Prev_Value(events);
      width = Am_Value::operator_cast_to_int(pAVar3);
    }
    else if (local_82 == 0x65) {
      pAVar3 = Am_Web_Events::Get_Prev_Value(events);
      height = Am_Value::operator_cast_to_int(pAVar3);
    }
    else if (local_82 == 0x66) {
      pAVar3 = Am_Web_Events::Get_Prev_Value(events);
      iStack_6c = Am_Value::operator_cast_to_int(pAVar3);
    }
    else if (local_82 == 0x67) {
      pAVar3 = Am_Web_Events::Get_Prev_Value(events);
      local_70 = Am_Value::operator_cast_to_int(pAVar3);
    }
    else if (local_82 != 0x68) {
      if (local_82 == 0x6b) {
        pAVar3 = Am_Web_Events::Get_Prev_Value(events);
        Am_Style::operator=((Am_Style *)&top,pAVar3);
      }
      else if (local_82 != 0x7d2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
        poVar4 = std::operator<<(poVar4,"** Bug: unexpected slot in polygon_web_validate: ");
        pcVar5 = Am_Get_Slot_Name(local_82);
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        Am_Error();
      }
    }
    Am_Web_Events::Prev(events);
  }
  Am_Web_Events::Next(events);
  do {
    bVar1 = Am_Web_Events::Last(events);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if ((((local_71 & 1) != 0) && (bVar1 = Am_Point_List::Valid((Am_Point_List *)&ls), bVar1)) &&
         (draw_00 != (Am_Drawonable *)0x0)) {
        Am_Style::Am_Style(&local_a8,(Am_Style *)&top);
        general_polygon_validate
                  ((Am_Point_List *)&ls,&width,&height,&stack0xffffffffffffff94,&local_70,&local_a8,
                   draw_00);
        Am_Style::~Am_Style(&local_a8);
      }
      if ((local_72 & 1) != 0) {
        value = Am_Point_List::operator_cast_to_Am_Wrapper_((Am_Point_List *)&ls);
        Am_Object::Set(&local_20,0xb2,value,0);
      }
      if ((local_73 & 1) != 0) {
        Am_Object::Set(&local_20,100,width,0);
        Am_Object::Set(&local_20,0x65,height,0);
        Am_Object::Set(&local_20,0x66,iStack_6c,0);
        Am_Object::Set(&local_20,0x67,local_70,0);
      }
      Am_Style::~Am_Style((Am_Style *)&top);
      Am_Point_List::~Am_Point_List((Am_Point_List *)&ls);
      Am_Object::~Am_Object(&local_20);
      return;
    }
    _new_top = Am_Web_Events::Get(events);
    self.data = (Am_Object_Data *)_new_top;
    AVar2 = Am_Slot::Get_Key((Am_Slot *)&self);
    if (AVar2 == 100) {
      pAVar3 = Am_Object::Get(&local_20,100,4);
      new_width = Am_Value::operator_cast_to_int(pAVar3);
      Am_Point_List::Translate((Am_Point_List *)&ls,new_width - width,0,true);
      width = new_width;
      local_72 = 1;
    }
    else if (AVar2 == 0x65) {
      pAVar3 = Am_Object::Get(&local_20,0x65,4);
      new_height = Am_Value::operator_cast_to_int(pAVar3);
      Am_Point_List::Translate((Am_Point_List *)&ls,0,new_height - height,true);
      height = new_height;
      local_72 = 1;
    }
    else if (AVar2 == 0x66) {
      pAVar3 = Am_Object::Get(&local_20,0x66,4);
      local_9c = Am_Value::operator_cast_to_int(pAVar3);
      fVar6 = scale_factor(local_9c,iStack_6c);
      Am_Point_List::Scale((Am_Point_List *)&ls,fVar6,1.0,width,height,true);
      iStack_6c = local_9c;
      local_71 = 1;
      local_72 = 1;
    }
    else if (AVar2 == 0x67) {
      pAVar3 = Am_Object::Get(&local_20,0x67,4);
      local_a0 = Am_Value::operator_cast_to_int(pAVar3);
      fVar6 = scale_factor(local_a0,local_70);
      Am_Point_List::Scale((Am_Point_List *)&ls,1.0,fVar6,width,height,true);
      local_70 = local_a0;
      local_71 = 1;
      local_72 = 1;
    }
    else if (AVar2 == 0x68) {
LAB_0028c35b:
      bVar1 = Am_Point_List::Valid((Am_Point_List *)&ls);
      if ((bVar1) && (draw_00 != (Am_Drawonable *)0x0)) {
        (*draw_00->_vptr_Am_Drawonable[0x1c])
                  (draw_00,&ls,&top,&width,&height,&stack0xffffffffffffff94,&local_70);
      }
      local_73 = 1;
    }
    else if (AVar2 == 0x6b) {
      pAVar3 = Am_Object::Get(&local_20,0x6b,4);
      Am_Style::operator=((Am_Style *)&top,pAVar3);
      bVar1 = Am_Point_List::Valid((Am_Point_List *)&ls);
      if ((bVar1) && (draw_00 != (Am_Drawonable *)0x0)) {
        (*draw_00->_vptr_Am_Drawonable[0x1c])
                  (draw_00,&ls,&top,&width,&height,&stack0xffffffffffffff94,&local_70);
      }
      local_73 = 1;
    }
    else if (AVar2 == 0x7d2) goto LAB_0028c35b;
    Am_Web_Events::Next(events);
  } while( true );
}

Assistant:

static void
polygon_web_validate(Am_Web_Events &events)
{
  events.End();
  Am_Slot slot = events.Get();
  Am_Object self = slot.Get_Owner();
  Am_Drawonable *draw = Get_a_drawonable(self);
  Am_Point_List pl = self.Get(Am_POINT_LIST);
  Am_Style ls = self.Get(Am_LINE_STYLE);
  int left = self.Get(Am_LEFT);
  int top = self.Get(Am_TOP);
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);

  bool rescaled = false;
  bool pl_changed = false;
  bool bbox_changed = false;

  // compute ORIGINAL values of left/top/width/height by working
  // backwards through the change events
  events.End();
  while (!events.First()) {
    slot = events.Get();

    Am_Slot_Key key = slot.Get_Key();
    if (key == Am_POINT_LIST) {
      // these changes supersedes all earlier changes, so find its
      // bounding box and stop looking backwards
      if (pl.Valid() && draw)
        draw->Get_Polygon_Bounding_Box(pl, ls, left, top, width, height);
      bbox_changed = true;
      break;
    } else
      switch (key) {
      case Am_WINDOW:
      case Am_DRAWONABLE:
        break;
      case Am_LINE_STYLE:
        ls = events.Get_Prev_Value();
        break;
      case Am_LEFT:
        left = events.Get_Prev_Value();
        break;
      case Am_TOP:
        top = events.Get_Prev_Value();
        break;
      case Am_WIDTH:
        width = events.Get_Prev_Value();
        break;
      case Am_HEIGHT:
        height = events.Get_Prev_Value();
        break;

      default:
        Am_ERROR("** Bug: unexpected slot in polygon_web_validate: "
                 << Am_Get_Slot_Name(key));
      }

    events.Prev();
  }

  // now go forwards, looking at the CHANGES made to each slot
  events.Next();
  while (!events.Last()) {
    slot = events.Get();
    switch (slot.Get_Key()) {
#if 0
    case Am_POINT_LIST:
      pl = self.Get (Am_POINT_LIST);
      if (pl.Valid() && draw)
	draw->Get_Polygon_Bounding_Box(pl, ls, left, top, width, height);
      bbox_changed = true;
      break;
#endif

    case Am_WINDOW:
    case Am_DRAWONABLE:
      if (pl.Valid() && draw)
        draw->Get_Polygon_Bounding_Box(pl, ls, left, top, width, height);
      bbox_changed = true;
      break;

    case Am_LINE_STYLE:
      // recompute bounding box with new line style
      ls = self.Get(Am_LINE_STYLE, Am_NO_DEPENDENCY);
      if (pl.Valid() && draw)
        draw->Get_Polygon_Bounding_Box(pl, ls, left, top, width, height);
      bbox_changed = true;
      break;

    case Am_LEFT: {
      int new_left = self.Get(Am_LEFT, Am_NO_DEPENDENCY);
      pl.Translate(new_left - left, 0);
      left = new_left;
      pl_changed = true;
      break;
    }

    case Am_TOP: {
      int new_top = self.Get(Am_TOP, Am_NO_DEPENDENCY);
      pl.Translate(0, new_top - top);
      top = new_top;
      pl_changed = true;
      break;
    }

    case Am_WIDTH: {
      int new_width = self.Get(Am_WIDTH, Am_NO_DEPENDENCY);
      pl.Scale(scale_factor(new_width, width), 1.0f, left, top);
      width = new_width;
      rescaled = true;
      pl_changed = true;
      break;
    }

    case Am_HEIGHT: {
      int new_height = self.Get(Am_HEIGHT, Am_NO_DEPENDENCY);
      pl.Scale(1.0f, scale_factor(new_height, height), left, top);
      height = new_height;
      rescaled = true;
      pl_changed = true;
      break;
    }
    }
    events.Next();
  }

  if (rescaled && pl.Valid() && draw)
    // check that scaling produced a polygon with the correct bounding box.
    // how could this fail?  several possibilities: line thickness
    // doesn't scale;  and mitered joins may grow or shrink
    // orthogonally to the scaling.

    general_polygon_validate(pl, left, top, width, height, ls, draw);

#ifdef TEST_POLYGON_CONSTRAINT
  // debugging check that bounding box is correct
  if (pl.Valid() && draw) {
    int curr_left, curr_top, curr_width, curr_height;
    draw->Get_Polygon_Bounding_Box(pl, ls, curr_left, curr_top, curr_width,
                                   curr_height);
    if (!(left == curr_left && top == curr_top && width == curr_width &&
          height == curr_height))
      std::cout << "** polygon_web_validate: bounding box (" << left << ","
                << top << "," << width << "," << height << ")"
                << " inconsistent with point list (" << curr_left << ","
                << curr_top << "," << curr_width << "," << curr_height << ")"
                << std::endl;
  }
#endif

  if (pl_changed)
    self.Set(Am_POINT_LIST, pl);

  if (bbox_changed) {
    self.Set(Am_LEFT, left);
    self.Set(Am_TOP, top);
    self.Set(Am_WIDTH, width);
    self.Set(Am_HEIGHT, height);
  }
}